

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionContext_AddPeginTxIn_Test::TestBody
          (ConfidentialTransactionContext_AddPeginTxIn_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *message;
  ConfidentialAssetId local_540;
  undefined1 local_518 [16];
  Script claim_script;
  ConfidentialAssetId asset;
  AssertionResult gtest_ar;
  undefined1 local_498 [16];
  BlockHash mainchain_hash;
  Amount pegin_amount;
  OutPoint outpoint;
  ByteData txout_proof;
  ByteData tx_byte;
  ConfidentialTransactionContext txc;
  Address addr;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  void *local_318;
  void *local_300;
  void *local_2e8;
  code *local_2d0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_258;
  Script local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  ElementsConfidentialAddress ct_addr;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  _addr = local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&addr,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3","");
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&ct_addr,(string *)&addr);
  if (_addr != local_338) {
    operator_delete(_addr);
  }
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  ppuVar1 = &asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  asset._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3","")
  ;
  cfd::core::Txid::Txid((Txid *)&claim_script,(string *)&asset);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&claim_script,2);
  claim_script._vptr_Script = (_func_int **)&PTR__Txid_002e1e60;
  if (claim_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(claim_script.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (asset._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(asset._vptr_ConfidentialAssetId);
  }
  cfd::core::Amount::Amount(&pegin_amount,0xbefe33cc397c);
  ppuVar1 = &claim_script.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  claim_script._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&claim_script,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&claim_script);
  if (claim_script._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(claim_script._vptr_Script);
  }
  claim_script._vptr_Script = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&claim_script,
             "06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f","");
  cfd::core::BlockHash::BlockHash(&mainchain_hash,(string *)&claim_script);
  if (claim_script._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(claim_script._vptr_Script);
  }
  ppuVar1 = (pointer *)
            ((long)&local_540.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_540._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_540,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a","");
  cfd::core::Script::Script(&claim_script,(string *)&local_540);
  if (local_540._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_540._vptr_ConfidentialAssetId);
  }
  local_540._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_540,
             "02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000"
             ,"");
  cfd::core::ByteData::ByteData(&tx_byte,(string *)&local_540);
  if (local_540._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_540._vptr_ConfidentialAssetId);
  }
  local_540._vptr_ConfidentialAssetId = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_540,
             "03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105"
             ,"");
  cfd::core::ByteData::ByteData(&txout_proof,(string *)&local_540);
  if (local_540._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_540._vptr_ConfidentialAssetId);
  }
  cfd::ConfidentialTransactionContext::AddPeginTxIn
            ((OutPoint *)&txc,(Amount *)&outpoint,(ConfidentialAssetId *)&pegin_amount,
             (BlockHash *)&asset,(Script *)&mainchain_hash,(ByteData *)&claim_script,&tx_byte);
  local_518._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(100000);
  local_518[8] = extraout_DL;
  gtest_ar._0_8_ = local_498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_540,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)local_518);
  local_540._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
  if ((void *)CONCAT71(local_540.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_540.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_540.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_540.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_498) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_540._vptr_ConfidentialAssetId = (_func_int **)cfd::core::operator-(&pegin_amount,200000);
  local_540.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = extraout_DL_00;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)&txc,(Amount *)&ct_addr,&local_540,SUB81(&asset,0));
  local_540._vptr_ConfidentialAssetId =
       (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(200000);
  local_540.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
  cfd::ConfidentialTransactionContext::UpdateFeeAmount((Amount *)&txc,&local_540);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000\""
             ,(char *)local_540._vptr_ConfidentialAssetId,
             "020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000"
            );
  if (local_540._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
    operator_delete(local_540._vptr_ConfidentialAssetId);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_540);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x206,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_518,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_518);
    if (local_540._vptr_ConfidentialAssetId != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_540._vptr_ConfidentialAssetId != (_func_int **)0x0)) {
        (**(code **)(*local_540._vptr_ConfidentialAssetId + 8))();
      }
      local_540._vptr_ConfidentialAssetId = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (txout_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(txout_proof.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (tx_byte.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tx_byte.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&claim_script);
  mainchain_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_002e21a0;
  if (mainchain_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mainchain_hash.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
  if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002e1e60;
  if (outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(outpoint.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_200);
  cfd::core::Script::~Script(&local_240);
  local_2d0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_258);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_2d0);
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8);
  }
  if (local_300 != (void *)0x0) {
    operator_delete(local_300);
  }
  if (local_318 != (void *)0x0) {
    operator_delete(local_318);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0]);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPeginTxIn)
{
  ConfidentialTransactionContext txc(2, 0);
  ElementsConfidentialAddress ct_addr("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
  Address addr = ct_addr.GetUnblindedAddress();
  OutPoint outpoint = OutPoint(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 2);
  Amount pegin_amount(int64_t{209998999992700});
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  BlockHash mainchain_hash("06226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f");
  Script claim_script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a");
  ByteData tx_byte("02000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d1000000");
  ByteData txout_proof("03000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d90105");
  txc.AddPeginTxIn(outpoint, pegin_amount, asset, mainchain_hash, claim_script, tx_byte, txout_proof);
  txc.AddTxOutFee(
      Amount::CreateBySatoshiAmount(100000),
      ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
  txc.AddTxOut(
      ct_addr,
      pegin_amount - 200000,
      asset);
  txc.UpdateFeeAmount(Amount::CreateBySatoshiAmount(200000), asset);

  EXPECT_STREQ(txc.GetHex().c_str(), "020000000101a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0200004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000030d4000000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33c92c3c03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac0000000000000006087c39cc33febe00002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a200f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206160014e8d28b573816ddfcf98578d7b28543e273f5a72ae002000000014578ddc14da3e19445b6e7b4c61d4af711d29e2703161aa9c11e4e6b0ea08843010000006b483045022100eea27e89c3cf2867393263bece040f34c03e0cddfa93a1a18c0d2e4322a37df7022074273c0ab3836affba53737c83673ca6c0d69bffdf722b4accfd7c0a9b2ea4e60121020bfcdbda850cd250c3995dfdb426dc40a9c8a5b378be2bf39f6b0642a783daf2feffffff02281d2418010000001976a914b56872c7b363bfb3f5af84d071ff282cf2abfe3988ac00e1f5050000000017a9141d4796c6e855ae00acecb0c20f65dd8bbeffb1ec87d10000009703000030ffba1d575800bf37a1ee1962dee7e153c18bcfc93cd013e7c297d5363b36cc2d63d5c4a9fdc746b9d3f4f62995d611c34ee9740ff2b5193ce458fdac6d173800ec402e5affff7f200500000002000000027ce06590120cf8c2bef7726200f0fa655940cadcf62708d7dc9f8f2a417c890b81af4d4299758e7e7a0daa6e7e3d3ec37f97df4ef2392ae5e6d286fc5e7e01d9010500000000");
}